

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O3

int parg_getopt_long(parg_state *ps,int argc,char **argv,char *optstring,parg_option *longopts,
                    int *longindex)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  
  if (ps == (parg_state *)0x0) {
    __assert_fail("ps != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa2
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  if (argv == (char **)0x0) {
    __assert_fail("argv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa3
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  if (optstring == (char *)0x0) {
    __assert_fail("optstring != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",0xa4
                  ,
                  "int parg_getopt_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                 );
  }
  ps->optarg = (char *)0x0;
  if (argc < 2) {
    return -1;
  }
  pcVar6 = ps->nextchar;
  if ((pcVar6 == (char *)0x0) || (cVar5 = *pcVar6, cVar5 == '\0')) {
    iVar3 = ps->optind;
    if (argc <= iVar3) {
      return -1;
    }
    pcVar6 = argv[iVar3];
    if (pcVar6 == (char *)0x0) {
      return -1;
    }
    ps->optind = iVar3 + 1;
    ps->nextchar = pcVar6;
    if (*pcVar6 != '-') {
LAB_0010a1c7:
      ps->optarg = pcVar6;
      ps->nextchar = (char *)0x0;
      return 1;
    }
    if (pcVar6[1] == '-') {
      if (pcVar6[2] == '\0') {
        ps->nextchar = (char *)0x0;
        return -1;
      }
      if (longopts != (parg_option *)0x0) {
        ps->nextchar = pcVar6 + 2;
        iVar3 = match_long(ps,argc,argv,optstring,longopts,longindex);
        return iVar3;
      }
    }
    else if (pcVar6[1] == '\0') goto LAB_0010a1c7;
    pcVar6 = pcVar6 + 1;
    ps->nextchar = pcVar6;
    cVar5 = *pcVar6;
  }
  pcVar4 = strchr(optstring,(int)cVar5);
  if (pcVar4 == (char *)0x0) {
    ps->nextchar = pcVar6 + 1;
    ps->optopt = (int)*pcVar6;
    return 0x3f;
  }
  pcVar1 = pcVar6 + 1;
  if (pcVar4[1] == ':') {
    if (*pcVar1 == '\0') {
      if (pcVar4[2] == ':') goto LAB_0010a1f7;
      iVar3 = ps->optind;
      if ((argc <= iVar3) || (pcVar2 = argv[iVar3], pcVar2 == (char *)0x0)) {
        ps->nextchar = pcVar1;
        ps->optopt = (int)*pcVar6;
        return (uint)(*optstring != ':') * 5 + 0x3a;
      }
      ps->optind = iVar3 + 1;
      ps->optarg = pcVar2;
    }
    else {
      ps->optarg = pcVar1;
    }
    ps->nextchar = (char *)0x0;
    cVar5 = *pcVar4;
  }
  else {
LAB_0010a1f7:
    ps->nextchar = pcVar1;
    cVar5 = *pcVar6;
  }
  return (int)cVar5;
}

Assistant:

int
parg_getopt_long(struct parg_state *ps, int argc, char *const argv[],
                 const char *optstring,
                 const struct parg_option *longopts, int *longindex)
{
	assert(ps != NULL);
	assert(argv != NULL);
	assert(optstring != NULL);

	ps->optarg = NULL;

	if (argc < 2) {
		return -1;
	}

	/* Advance to next element if needed */
	if (ps->nextchar == NULL || *ps->nextchar == '\0') {
		if (is_argv_end(ps, argc, argv)) {
			return -1;
		}

		ps->nextchar = argv[ps->optind++];

		/* Check for nonoption element (including '-') */
		if (ps->nextchar[0] != '-' || ps->nextchar[1] == '\0') {
			ps->optarg = ps->nextchar;
			ps->nextchar = NULL;
			return 1;
		}

		/* Check for '--' */
		if (ps->nextchar[1] == '-') {
			if (ps->nextchar[2] == '\0') {
				ps->nextchar = NULL;
				return -1;
			}

			if (longopts != NULL) {
				ps->nextchar += 2;

				return match_long(ps, argc, argv, optstring,
				                  longopts, longindex);
			}
		}

		ps->nextchar++;
	}

	/* Match nextchar */
	return match_short(ps, argc, argv, optstring);
}